

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDTDInternalEntity
              (xmlTextWriterPtr writer,int pe,xmlChar *name,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sum;
  int count;
  xmlChar *content_local;
  xmlChar *name_local;
  int pe_local;
  xmlTextWriterPtr writer_local;
  
  if (((name == (xmlChar *)0x0) || (*name == '\0')) || (content == (xmlChar *)0x0)) {
    writer_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlTextWriterStartDTDEntity(writer,pe,name);
    if (iVar1 == -1) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar2 = xmlTextWriterWriteString(writer,content);
      if (iVar2 == -1) {
        writer_local._4_4_ = -1;
      }
      else {
        iVar3 = xmlTextWriterEndDTDEntity(writer);
        if (iVar3 == -1) {
          writer_local._4_4_ = -1;
        }
        else {
          writer_local._4_4_ = iVar3 + iVar2 + iVar1;
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteDTDInternalEntity(xmlTextWriterPtr writer,
                                    int pe,
                                    const xmlChar * name,
                                    const xmlChar * content)
{
    int count;
    int sum;

    if ((name == NULL) || (*name == '\0') || (content == NULL))
        return -1;

    sum = 0;
    count = xmlTextWriterStartDTDEntity(writer, pe, name);
    if (count == -1)
        return -1;
    sum += count;

    count = xmlTextWriterWriteString(writer, content);
    if (count == -1)
        return -1;
    sum += count;

    count = xmlTextWriterEndDTDEntity(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}